

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O1

vector<QImage,_std::allocator<QImage>_> * __thiscall Controller::getImages(Controller *this)

{
  ImageProvider *this_00;
  BoardSize boardSize;
  vector<QImage,_std::allocator<QImage>_> *pvVar1;
  
  this_00 = (this->imageProvider)._M_t.
            super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>._M_t.
            super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>.
            super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl;
  boardSize = Board::getSize((this->board)._M_t.
                             super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
                             super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
                             super__Head_base<0UL,_Board_*,_false>._M_head_impl);
  pvVar1 = ImageProvider::getImages(this_00,boardSize);
  return pvVar1;
}

Assistant:

std::tuple<Move, size_t, size_t> Controller::undoMove()
{
    std::optional<size_t> position = undoMoveService->GetMove();
    if ( position == std::nullopt )
    {
        return { Move::NOT_ALLOWED, 0, 0 };
    }

    uint row = position.value() / 10;
    uint col = position.value() % 10;
    Move move = board->checkMove( row, col );
    return { move, row, col };
}